

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polyself.c
# Opt level: O3

int dohide(void)

{
  int iVar1;
  
  if (((u._1052_1_ & 4) == 0) && (((youmonst.data)->mlet != '\r' || (youmonst.m_ap_type == '\0'))))
  {
    if ((youmonst.data)->mlet == '\r') {
      youmonst.m_ap_type = '\x02';
      youmonst.mappearance = 0;
    }
    else {
      u._1052_1_ = u._1052_1_ | 4;
    }
    newsym((int)u.ux,(int)u.uy);
    iVar1 = 1;
  }
  else {
    iVar1 = 0;
    pline("You are already hiding.");
  }
  return iVar1;
}

Assistant:

int dohide(void)
{
	boolean ismimic = youmonst.data->mlet == S_MIMIC;

	if (u.uundetected || (ismimic && youmonst.m_ap_type != M_AP_NOTHING)) {
		pline("You are already hiding.");
		return 0;
	}
	if (ismimic) {
		/* should bring up a dialog "what would you like to imitate?" */
		youmonst.m_ap_type = M_AP_OBJECT;
		youmonst.mappearance = STRANGE_OBJECT;
	} else
		u.uundetected = 1;
	newsym(u.ux,u.uy);
	return 1;
}